

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::updateMkspecPaths(QMakeEvaluator *this)

{
  QMakeGlobals *pQVar1;
  long lVar2;
  QString *it;
  QArrayData *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  ProKey local_148;
  ProString local_118;
  QStringBuilder<ProString,_const_QString_&> local_e8;
  QString local_b0;
  QArrayDataPointer<QString> local_98;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  QVar4.m_data = &DAT_00000008;
  QVar4.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar4);
  local_78.d.d = local_e8.a.m_string.d.d;
  local_78.d.ptr = local_e8.a.m_string.d.ptr;
  local_78.d.size = local_e8.a.m_string.d.size;
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->m_option;
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_e8;
  QString::fromLatin1(QVar5);
  local_118.m_string.d.d = local_e8.a.m_string.d.d;
  local_118.m_string.d.ptr = local_e8.a.m_string.d.ptr;
  local_118.m_string.d.size = local_e8.a.m_string.d.size;
  QMakeGlobals::getPathListEnv((QStringList *)&local_98,pQVar1,&local_118.m_string);
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
    lVar2 = local_98.size * 0x18;
    pQVar3 = (QArrayData *)local_98.ptr;
    do {
      local_118.m_string.d.d = (Data *)pQVar3;
      local_118.m_string.d.ptr = (char16_t *)&local_78;
      QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                ((QString *)&local_e8,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_118
                );
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_58,local_58.size,(QString *)&local_e8);
      QList<QString>::end((QList<QString> *)&local_58);
      if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = (QArrayData *)&pQVar3[1].alloc;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  lVar2 = (this->m_qmakepath).d.size;
  if (lVar2 != 0) {
    pQVar3 = (QArrayData *)(this->m_qmakepath).d.ptr;
    lVar2 = lVar2 * 0x18;
    do {
      local_118.m_string.d.d = (Data *)pQVar3;
      local_118.m_string.d.ptr = (char16_t *)&local_78;
      QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                ((QString *)&local_e8,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_118
                );
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_58,local_58.size,(QString *)&local_e8);
      QList<QString>::end((QList<QString> *)&local_58);
      if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = (QArrayData *)&pQVar3[1].alloc;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  if ((this->m_buildRoot).d.size != 0) {
    local_118.m_string.d.d = (Data *)&this->m_buildRoot;
    local_118.m_string.d.ptr = (char16_t *)&local_78;
    QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_e8,(QStringBuilder<QString_&,_const_QString_&> *)&local_118);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,(QString *)&local_e8);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_sourceRoot).d.size != 0) {
    local_118.m_string.d.d = (Data *)&this->m_sourceRoot;
    local_118.m_string.d.ptr = (char16_t *)&local_78;
    QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
              ((QString *)&local_e8,(QStringBuilder<QString_&,_const_QString_&> *)&local_118);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_58,local_58.size,(QString *)&local_e8);
    QList<QString>::end((QList<QString> *)&local_58);
    if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = this->m_option;
  ProKey::ProKey(&local_148,"QT_HOST_DATA/get");
  QMakeProperty::value(&local_118,pQVar1->property,&local_148);
  ProString::ProString(&local_e8.a,&local_118);
  local_e8.b = &local_78;
  QStringBuilder<ProString,_const_QString_&>::convertTo<QString>(&local_b0,&local_e8);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_b0);
  QList<QString>::end((QList<QString> *)&local_58);
  if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = this->m_option;
  ProKey::ProKey(&local_148,"QT_HOST_DATA/src");
  QMakeProperty::value(&local_118,pQVar1->property,&local_148);
  ProString::ProString(&local_e8.a,&local_118);
  local_e8.b = &local_78;
  QStringBuilder<ProString,_const_QString_&>::convertTo<QString>(&local_b0,&local_e8);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_b0);
  QList<QString>::end((QList<QString> *)&local_58);
  if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_e8.a.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_e8.a.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_e8.a.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_118.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_148.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::QStringList_removeDuplicates((QList *)&local_58);
  QArrayDataPointer<QString>::operator=(&(this->m_mkspecPaths).d,&local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::updateMkspecPaths()
{
    QStringList ret;
    const QString concat = QLatin1String("/mkspecs");

    const auto paths = m_option->getPathListEnv(QLatin1String("QMAKEPATH"));
    for (const QString &it : paths)
        ret << it + concat;

    for (const QString &it : std::as_const(m_qmakepath))
        ret << it + concat;

    if (!m_buildRoot.isEmpty())
        ret << m_buildRoot + concat;
    if (!m_sourceRoot.isEmpty())
        ret << m_sourceRoot + concat;

    ret << m_option->propertyValue(ProKey("QT_HOST_DATA/get")) + concat;
    ret << m_option->propertyValue(ProKey("QT_HOST_DATA/src")) + concat;

    ret.removeDuplicates();
    m_mkspecPaths = ret;
}